

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeArrayBufferConstructor
               (DynamicObject *arrayBufferConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  PropertyString *pPVar1;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayBufferConstructor,mode,4,0);
  this = (((arrayBufferConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0x124,
             (((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             arrayBufferPrototype.ptr,0,0,0,0);
  AddSpeciesAccessorsToLibraryObject
            (this,arrayBufferConstructor,(FunctionInfo *)ArrayBuffer::EntryInfo::GetterSymbolSpecies
            );
  pPVar1 = ScriptContext::GetPropertyString(this_00,0x1ac);
  (*(arrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferConstructor,0x106,pPVar1,2,0,0,0);
  AddFunctionToLibraryObject
            (this,arrayBufferConstructor,200,(FunctionInfo *)ArrayBuffer::EntryInfo::IsView,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,arrayBufferConstructor,0x73,(FunctionInfo *)ArrayBuffer::EntryInfo::Detach,1,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(arrayBufferConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayBufferConstructor(DynamicObject* arrayBufferConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayBufferConstructor, mode, 4);

        ScriptContext* scriptContext = arrayBufferConstructor->GetScriptContext();
        JavascriptLibrary* library = arrayBufferConstructor->GetLibrary();
        library->AddMember(arrayBufferConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(arrayBufferConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->arrayBufferPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(arrayBufferConstructor, &ArrayBuffer::EntryInfo::GetterSymbolSpecies);
        library->AddMember(arrayBufferConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::ArrayBuffer), PropertyConfigurable);

        library->AddFunctionToLibraryObject(arrayBufferConstructor, PropertyIds::isView, &ArrayBuffer::EntryInfo::IsView, 1);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        library->AddFunctionToLibraryObject(arrayBufferConstructor, PropertyIds::detach, &ArrayBuffer::EntryInfo::Detach, 1);
#endif
        arrayBufferConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }